

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_importCascadingUnitsImports_Test::TestBody
          (ModelFlattening_importCascadingUnitsImports_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  element_type *peVar4;
  AssertHelper local_1c8 [8];
  Message local_1c0 [8];
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_2;
  string a;
  PrinterPtr printer;
  Message local_170 [8];
  unsigned_long local_168 [2];
  undefined1 local_158 [8];
  AssertionResult gtest_ar_1;
  ModelPtr flatModel;
  Message local_130 [8];
  unsigned_long local_128 [2];
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  string local_100 [32];
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98 [32];
  undefined1 local_78 [8];
  ModelPtr model;
  ParserPtr parser;
  ImporterPtr importer;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string e;
  ModelFlattening_importCascadingUnitsImports_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n  <units name=\"units1_import\">\n    <unit exponent=\"-2\" units=\"second\"/>\n    <unit units=\"units2_import\"/>\n  </units>\n  <units name=\"first_units\">\n    <unit exponent=\"-1\" units=\"second\"/>\n    <unit units=\"units1_import\"/>\n  </units>\n  <units name=\"units2_import\">\n    <unit exponent=\"-0.5\" units=\"second\"/>\n  </units>\n  <component name=\"base_component\">\n    <variable name=\"variable\" units=\"first_units\"/>\n  </component>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  libcellml::Importer::create((bool)((char)&parser + '\b'));
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"importer/model_cascaded_units.cellml",&local_b9);
  fileContents(local_98);
  libcellml::Parser::parseModel((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"importer",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  resourcePath(local_e0);
  libcellml::Importer::resolveImports((shared_ptr *)peVar2,(string *)local_78);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_128[1] = 0;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_128[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_118,"size_t(0)","importer->errorCount()",local_128 + 1,
             local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x56f,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_130);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar_1.message_);
  local_168[1] = 0;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_168[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_158,"size_t(0)","importer->issueCount()",local_168 + 1,
             local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x572,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_170);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  libcellml::Printer::create();
  peVar4 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar_2.message_,SUB81(peVar4,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1b8,"e","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_2.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x576,pcVar3);
    testing::internal::AssertHelper::operator=(local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(local_1c8);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)((long)&a.field_2 + 8));
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_78);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ModelFlattening, importCascadingUnitsImports)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n"
        "  <units name=\"units1_import\">\n"
        "    <unit exponent=\"-2\" units=\"second\"/>\n"
        "    <unit units=\"units2_import\"/>\n"
        "  </units>\n"
        "  <units name=\"first_units\">\n"
        "    <unit exponent=\"-1\" units=\"second\"/>\n"
        "    <unit units=\"units1_import\"/>\n"
        "  </units>\n"
        "  <units name=\"units2_import\">\n"
        "    <unit exponent=\"-0.5\" units=\"second\"/>\n"
        "  </units>\n"
        "  <component name=\"base_component\">\n"
        "    <variable name=\"variable\" units=\"first_units\"/>\n"
        "  </component>\n"
        "</model>\n";

    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(fileContents("importer/model_cascaded_units.cellml"));

    importer->resolveImports(model, resourcePath("importer"));
    EXPECT_EQ(size_t(0), importer->errorCount());

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ(size_t(0), importer->issueCount());

    auto printer = libcellml::Printer::create();
    const std::string a = printer->printModel(flatModel);
    EXPECT_EQ(e, a);
}